

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O1

int str_find_aux(lua_State *L,int find)

{
  GCstr *pGVar1;
  char cVar2;
  TValue *pTVar3;
  int32_t iVar4;
  int iVar5;
  uint uVar6;
  GCstr *pGVar7;
  GCstr *s;
  char *e;
  char *pcVar8;
  MSize MVar9;
  GCstr *p;
  uint uVar10;
  bool bVar11;
  MatchState ms;
  int local_258;
  MatchState local_250;
  
  pGVar7 = lj_lib_checkstr(L,1);
  s = lj_lib_checkstr(L,2);
  iVar4 = lj_lib_optint(L,3,1);
  MVar9 = 0xffffffff;
  if (iVar4 < 0) {
    MVar9 = pGVar7->len;
  }
  uVar10 = 0;
  if (0 < (int)(MVar9 + iVar4)) {
    uVar10 = MVar9 + iVar4;
  }
  if (pGVar7->len <= uVar10) {
    uVar10 = pGVar7->len;
  }
  if ((find == 0) ||
     (((L->top <= L->base + 3 || (*(short *)((long)L->base + 0x1e) == -1)) &&
      (iVar5 = lj_str_haspattern(s), iVar5 != 0)))) {
    pGVar1 = pGVar7 + 1;
    cVar2 = (char)s[1].nextgc.gcptr64;
    p = (GCstr *)((long)&s[1].nextgc.gcptr64 + 1);
    if (cVar2 != '^') {
      p = s + 1;
    }
    local_250.src_end = (char *)((long)&pGVar7[1].nextgc.gcptr64 + (ulong)pGVar7->len);
    pcVar8 = (char *)((long)&pGVar7[1].nextgc.gcptr64 + (ulong)uVar10);
    local_250.src_init = (char *)pGVar1;
    local_250.L = L;
    do {
      uVar10 = uVar10 + 1;
      local_250.level = 0;
      local_250.depth = 0;
      e = match(&local_250,pcVar8,(char *)p);
      if (e != (char *)0x0) {
        if (find == 0) {
          uVar6 = push_captures(&local_250,pcVar8,e);
          pGVar7 = (GCstr *)(ulong)uVar6;
        }
        else {
          pTVar3 = L->top;
          L->top = pTVar3 + 1;
          pTVar3->n = (double)(int)uVar10;
          pTVar3 = L->top;
          L->top = pTVar3 + 1;
          local_258 = (int)pGVar1;
          pTVar3->n = (double)((int)e - local_258);
          iVar5 = push_captures(&local_250,(char *)0x0,(char *)0x0);
          pGVar7 = (GCstr *)(ulong)(iVar5 + 2);
        }
      }
      if (e != (char *)0x0) {
        return (int)pGVar7;
      }
    } while ((cVar2 != '^') && (bVar11 = pcVar8 < local_250.src_end, pcVar8 = pcVar8 + 1, bVar11));
  }
  else {
    pcVar8 = lj_str_find((char *)((long)&pGVar7[1].nextgc.gcptr64 + (ulong)uVar10),(char *)(s + 1),
                         pGVar7->len - uVar10,s->len);
    if (pcVar8 != (char *)0x0) {
      iVar5 = (int)pcVar8 - ((int)pGVar7 + 0x18);
      L->top[-2].n = (double)(iVar5 + 1);
      L->top[-1].n = (double)(int)(iVar5 + s->len);
      return 2;
    }
  }
  L->top[-1].u64 = 0xffffffffffffffff;
  return 1;
}

Assistant:

static int str_find_aux(lua_State *L, int find)
{
  GCstr *s = lj_lib_checkstr(L, 1);
  GCstr *p = lj_lib_checkstr(L, 2);
  int32_t start = lj_lib_optint(L, 3, 1);
  MSize st;
  if (start < 0) start += (int32_t)s->len; else start--;
  if (start < 0) start = 0;
  st = (MSize)start;
  if (st > s->len) {
#if LJ_52
    setnilV(L->top-1);
    return 1;
#else
    st = s->len;
#endif
  }
  if (find && ((L->base+3 < L->top && tvistruecond(L->base+3)) ||
	       !lj_str_haspattern(p))) {  /* Search for fixed string. */
    const char *q = lj_str_find(strdata(s)+st, strdata(p), s->len-st, p->len);
    if (q) {
      setintV(L->top-2, (int32_t)(q-strdata(s)) + 1);
      setintV(L->top-1, (int32_t)(q-strdata(s)) + (int32_t)p->len);
      return 2;
    }
  } else {  /* Search for pattern. */
    MatchState ms;
    const char *pstr = strdata(p);
    const char *sstr = strdata(s) + st;
    int anchor = 0;
    if (*pstr == '^') { pstr++; anchor = 1; }
    ms.L = L;
    ms.src_init = strdata(s);
    ms.src_end = strdata(s) + s->len;
    do {  /* Loop through string and try to match the pattern. */
      const char *q;
      ms.level = ms.depth = 0;
      q = match(&ms, sstr, pstr);
      if (q) {
	if (find) {
	  setintV(L->top++, (int32_t)(sstr-(strdata(s)-1)));
	  setintV(L->top++, (int32_t)(q-strdata(s)));
	  return push_captures(&ms, NULL, NULL) + 2;
	} else {
	  return push_captures(&ms, sstr, q);
	}
      }
    } while (sstr++ < ms.src_end && !anchor);
  }
  setnilV(L->top-1);  /* Not found. */
  return 1;
}